

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O0

int __thiscall gl4cts::BufferStorageTests::init(BufferStorageTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  GetBufferParameterTest *this_00;
  MapPersistentTextureTest *this_01;
  BufferStorageTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  BufferStorage::ErrorsTest::ErrorsTest((ErrorsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_00 = (GetBufferParameterTest *)operator_new(0x90);
  BufferStorage::GetBufferParameterTest::GetBufferParameterTest
            (this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  pTVar1 = (TestNode *)operator_new(0x78);
  BufferStorage::DynamicStorageTest::DynamicStorageTest
            ((DynamicStorageTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  BufferStorage::MapPersistentBufferSubDataTest::MapPersistentBufferSubDataTest
            ((MapPersistentBufferSubDataTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_01 = (MapPersistentTextureTest *)operator_new(0x80);
  BufferStorage::MapPersistentTextureTest::MapPersistentTextureTest
            (this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  pTVar1 = (TestNode *)operator_new(0x78);
  BufferStorage::MapPersistentReadPixelsTest::MapPersistentReadPixelsTest
            ((MapPersistentReadPixelsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  BufferStorage::MapPersistentDispatchTest::MapPersistentDispatchTest
            ((MapPersistentDispatchTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  BufferStorage::MapPersistentFlushTest::MapPersistentFlushTest
            ((MapPersistentFlushTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  BufferStorage::MapPersistentDrawTest::MapPersistentDrawTest
            ((MapPersistentDrawTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void BufferStorageTests::init(void)
{
	addChild(new BufferStorage::ErrorsTest(m_context));
	addChild(new BufferStorage::GetBufferParameterTest(m_context));
	addChild(new BufferStorage::DynamicStorageTest(m_context));
	addChild(new BufferStorage::MapPersistentBufferSubDataTest(m_context));
	addChild(new BufferStorage::MapPersistentTextureTest(m_context));
	addChild(new BufferStorage::MapPersistentReadPixelsTest(m_context));
	addChild(new BufferStorage::MapPersistentDispatchTest(m_context));
	addChild(new BufferStorage::MapPersistentFlushTest(m_context));
	addChild(new BufferStorage::MapPersistentDrawTest(m_context));
}